

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

void __thiscall QLabelPrivate::ensureTextPopulated(QLabelPrivate *this)

{
  int *piVar1;
  bool bVar2;
  QArrayData *pQVar3;
  char cVar4;
  byte bVar5;
  ushort uVar6;
  undefined4 uVar7;
  QTextDocument *pQVar8;
  bool bVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QStringView QVar11;
  QLatin1String QVar12;
  QTextCursor cursor;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  long local_68;
  QArrayData *local_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = *(ushort *)&this->field_0x340;
  if ((uVar6 & 8) != 0) {
    if ((QWidgetTextControl *)this->control != (QWidgetTextControl *)0x0) {
      pQVar8 = QWidgetTextControl::document((QWidgetTextControl *)this->control);
      uVar6 = *(ushort *)&this->field_0x340;
      if ((uVar6 & 8) != 0) {
        if (this->effectiveTextFormat == MarkdownText) {
          QTextDocument::setMarkdown(pQVar8,&this->text,0x104f0c);
        }
        else if (this->effectiveTextFormat == RichText) {
          QTextDocument::setHtml((QString *)pQVar8);
        }
        else {
          QTextDocument::setPlainText((QString *)pQVar8);
        }
        uVar7 = 0;
        QTextDocument::setUndoRedoEnabled(SUB81(pQVar8,0));
        uVar6 = *(ushort *)&this->field_0x340;
        if ((uVar6 & 0x20) != 0) {
          local_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
          QTextCursor::QTextCursor((QTextCursor *)&local_60);
          bVar9 = false;
          while( true ) {
            pQVar8 = QWidgetTextControl::document((QWidgetTextControl *)this->control);
            QVar10.m_data = (storage_type *)0x1;
            QVar10.m_size = (qsizetype)&local_58;
            QString::fromLatin1(QVar10);
            local_78 = (undefined4)local_58;
            uStack_74 = local_58._4_4_;
            uStack_70 = uStack_50;
            uStack_6c = uStack_4c;
            local_68 = local_48;
            QTextDocument::find((QTextCursor *)&local_58,pQVar8,&local_78,uVar7,0);
            pQVar3 = local_60;
            local_60 = local_58;
            local_58 = pQVar3;
            cVar4 = QTextCursor::isNull();
            QTextCursor::~QTextCursor((QTextCursor *)&local_58);
            piVar1 = (int *)CONCAT44(uStack_74,local_78);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                QArrayData::deallocate((QArrayData *)CONCAT44(uStack_74,local_78),2,0x10);
              }
            }
            if (cVar4 != '\0') break;
            QTextCursor::deleteChar();
            QTextCursor::movePosition((MoveOperation)(QTextCursor *)&local_60,0x11,1);
            uVar7 = QTextCursor::position();
            bVar2 = !bVar9;
            bVar9 = true;
            if (bVar2) {
              QTextCursor::selectedText();
              bVar5 = 1;
              if (local_48 == 1) {
                QVar11.m_data._4_4_ = uStack_4c;
                QVar11.m_data._0_4_ = uStack_50;
                QVar11.m_size = 1;
                QVar12.m_data = "&";
                QVar12.m_size = 1;
                bVar5 = QtPrivate::equalStrings(QVar11,QVar12);
                bVar5 = bVar5 ^ 1;
              }
              if (local_58 != (QArrayData *)0x0) {
                LOCK();
                (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_58,2,0x10);
                }
              }
              bVar9 = false;
              if (bVar5 != 0) {
                QTextCursor::operator=(&this->shortcutCursor,(QTextCursor *)&local_60);
                bVar9 = true;
              }
            }
          }
          QTextCursor::~QTextCursor((QTextCursor *)&local_60);
          uVar6 = *(ushort *)&this->field_0x340;
        }
      }
    }
    *(ushort *)&this->field_0x340 = uVar6 & 0xfff7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::ensureTextPopulated() const
{
    if (!textDirty)
        return;
    if (control) {
        QTextDocument *doc = control->document();
        if (textDirty) {
            if (effectiveTextFormat == Qt::PlainText) {
                doc->setPlainText(text);
#if QT_CONFIG(texthtmlparser)
            } else if (effectiveTextFormat == Qt::RichText) {
                doc->setHtml(text);
#endif
#if QT_CONFIG(textmarkdownreader)
            } else if (effectiveTextFormat == Qt::MarkdownText) {
                doc->setMarkdown(text);
#endif
            } else {
                doc->setPlainText(text);
            }
            doc->setUndoRedoEnabled(false);

#ifndef QT_NO_SHORTCUT
            if (hasShortcut) {
                // Underline the first character that follows an ampersand (and remove the others ampersands)
                int from = 0;
                bool found = false;
                QTextCursor cursor;
                while (!(cursor = control->document()->find(("&"_L1), from)).isNull()) {
                    cursor.deleteChar(); // remove the ampersand
                    cursor.movePosition(QTextCursor::NextCharacter, QTextCursor::KeepAnchor);
                    from = cursor.position();
                    if (!found && cursor.selectedText() != "&"_L1) { //not a second &
                        found = true;
                        shortcutCursor = cursor;
                    }
                }
            }
#endif
        }
    }
    textDirty = false;
}